

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void checkLinkError(GLuint program)

{
  ulong uVar1;
  uint in_EAX;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  undefined4 in_register_0000003c;
  GLint logSize;
  GLint success;
  
  _logSize = (ulong)in_EAX;
  (*__glewGetProgramiv)(CONCAT44(in_register_0000003c,program),0x8b82,&success);
  if (success == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Shader link failed.");
    std::endl<char,std::char_traits<char>>(poVar3);
    _logSize = _logSize & 0xffffffff00000000;
    (*__glewGetProgramiv)(program,0x8b84,&logSize);
    uVar1 = _logSize;
    if (logSize == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"No log found.");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      iVar2 = -1;
      if (-1 < logSize) {
        iVar2 = logSize;
      }
      pcVar4 = (char *)operator_new__((long)iVar2);
      (*__glewGetProgramInfoLog)(program,uVar1 & 0xffffffff,&logSize,pcVar4);
      poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar3);
      operator_delete__(pcVar4);
    }
  }
  return;
}

Assistant:

void checkLinkError(GLuint program) {
    GLint success = 0;
    glGetProgramiv(program, GL_LINK_STATUS, &success);
    if (success) return;

    cout << "Shader link failed." << endl;

    GLint logSize = 0;
    glGetProgramiv(program, GL_INFO_LOG_LENGTH, &logSize);
    if (logSize == 0) {
        cout << "No log found." << endl;
        return;
    }

    GLchar *log = new GLchar[logSize];

    glGetProgramInfoLog(program, logSize, &logSize, log);
    cout << log << endl;

    delete[] log;
}